

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

void tcg_expand_vec_op_sparc
               (TCGContext_conflict7 *tcg_ctx,TCGOpcode opc,TCGType_conflict type,uint vece,
               TCGArg a0,...)

{
  ulong *puVar1;
  uint uVar2;
  long lVar3;
  _Bool _Var4;
  TCGTemp *pTVar5;
  TCGTemp *pTVar6;
  TCGTemp *r;
  TCGTemp *b;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uintptr_t o_5;
  TCGv_vec pTVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  TCGArg i;
  TCGArg in_R9;
  uintptr_t o_9;
  uintptr_t o_3;
  TCGv_vec pTVar14;
  uintptr_t o_2;
  TCGv_vec pTVar15;
  uintptr_t o_7;
  int64_t i_00;
  TCGArg in_stack_00000008;
  TCGCond TStack0000000000000010;
  long in_stack_00000018;
  TCGCond in_stack_00000020;
  va_list va;
  uintptr_t o;
  uintptr_t o_1;
  ulong local_118;
  
  if (opc - INDEX_op_shli_vec < 0xc) {
    pTVar10 = (TCGv_vec)(a0 - (long)tcg_ctx);
    pTVar15 = (TCGv_vec)(in_R9 - (long)tcg_ctx);
    switch(opc) {
    case INDEX_op_shli_vec:
    case INDEX_op_shri_vec:
      pTVar5 = tcg_temp_new_internal_sparc(tcg_ctx,type,false);
      pTVar15 = (TCGv_vec)((long)pTVar5 - (long)tcg_ctx);
      pTVar6 = tcg_temp_new_internal_sparc(tcg_ctx,type,false);
      pTVar10 = (TCGv_vec)((long)pTVar6 - (long)tcg_ctx);
      uVar12 = ((long)(pTVar15 + -0x388) >> 3) * 0x6db6db6db6db6db7;
      vec_gen_3_sparc(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,(TCGArg)pTVar5,in_R9,in_R9);
      uVar7 = ((long)(pTVar10 + -0x388) >> 3) * 0x6db6db6db6db6db7;
      vec_gen_3_sparc(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,(TCGArg)pTVar6,in_R9,in_R9);
      i_00 = in_stack_00000008 + 8;
      if (opc != INDEX_op_shri_vec) {
        tcg_gen_shli_vec_sparc(tcg_ctx,1,pTVar15,pTVar15,i_00);
        tcg_gen_shli_vec_sparc(tcg_ctx,1,pTVar10,pTVar10,i_00);
        i_00 = 8;
      }
      tcg_gen_shri_vec_sparc(tcg_ctx,1,pTVar15,pTVar15,i_00);
      tcg_gen_shri_vec_sparc(tcg_ctx,1,pTVar10,pTVar10,i_00);
      vec_gen_3_sparc(tcg_ctx,INDEX_op_x86_packus_vec,type,0,a0,(TCGArg)pTVar5,(TCGArg)pTVar6);
      uVar8 = *(ulong *)((long)tcg_ctx + (long)pTVar15);
      *(ulong *)((long)tcg_ctx + (long)pTVar15) = uVar8 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar12 >> 6) * 8 +
                        (ulong)((((uint)(uVar8 >> 0x26) & 1) * 5 + ((uint)(uVar8 >> 0x10) & 0xff)) *
                               0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar12 & 0x3f);
      uVar12 = *(ulong *)((long)tcg_ctx + (long)pTVar10);
      *(ulong *)((long)tcg_ctx + (long)pTVar10) = uVar12 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar7 >> 6) * 8 +
                        (ulong)((((uint)(uVar12 >> 0x26) & 1) * 5 + ((uint)(uVar12 >> 0x10) & 0xff))
                               * 0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar7 & 0x3f);
      break;
    case INDEX_op_sari_vec:
      if (vece == 3) {
        if (in_stack_00000008 < 0x21) {
          pTVar5 = tcg_temp_new_internal_sparc(tcg_ctx,type,false);
          pTVar14 = (TCGv_vec)((long)pTVar5 - (long)tcg_ctx);
          i = 0x1f;
          if (in_stack_00000008 < 0x1f) {
            i = in_stack_00000008;
          }
          tcg_gen_sari_vec_sparc(tcg_ctx,2,pTVar14,pTVar15,i);
          tcg_gen_shri_vec_sparc(tcg_ctx,3,pTVar10,pTVar15,in_stack_00000008);
          vec_gen_4_sparc(tcg_ctx,INDEX_op_x86_blend_vec,type,2,a0,a0,(TCGArg)pTVar5,0xaa);
          uVar12 = *(ulong *)pTVar5;
          *(ulong *)pTVar5 = uVar12 & 0xffffff5fffffffff;
          uVar2 = (uint)(uVar12 >> 0x10);
        }
        else {
          pTVar14 = tcg_const_zeros_vec_sparc(tcg_ctx,type);
          tcg_gen_cmp_vec_sparc(tcg_ctx,TCG_COND_GT,3,pTVar14,pTVar14,pTVar15);
          tcg_gen_shri_vec_sparc(tcg_ctx,3,pTVar10,pTVar15,in_stack_00000008);
          tcg_gen_shli_vec_sparc(tcg_ctx,3,pTVar14,pTVar14,0x40 - in_stack_00000008);
          tcg_gen_or_vec_sparc(tcg_ctx,3,pTVar10,pTVar10,pTVar14);
          uVar12 = *(ulong *)(pTVar14 + (long)&tcg_ctx->pool_cur);
          *(ulong *)(pTVar14 + (long)&tcg_ctx->pool_cur) = uVar12 & 0xffffff5fffffffff;
          uVar2 = (uint)(uVar12 >> 0x10);
        }
        iVar9 = (uint)((uVar12 & 0x4000000000) != 0) * 5 + (uVar2 & 0xff);
      }
      else {
        if (vece != 0) {
          iVar9 = 0xd3c;
LAB_009d5d89:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                     ,iVar9,(char *)0x0);
        }
        pTVar5 = tcg_temp_new_internal_sparc(tcg_ctx,type,false);
        pTVar10 = (TCGv_vec)((long)pTVar5 - (long)tcg_ctx);
        pTVar6 = tcg_temp_new_internal_sparc(tcg_ctx,type,false);
        pTVar14 = (TCGv_vec)((long)pTVar6 - (long)tcg_ctx);
        uVar7 = ((long)(pTVar10 + -0x388) >> 3) * 0x6db6db6db6db6db7;
        vec_gen_3_sparc(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,(TCGArg)pTVar5,in_R9,in_R9);
        vec_gen_3_sparc(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,(TCGArg)pTVar6,in_R9,in_R9);
        tcg_gen_sari_vec_sparc(tcg_ctx,1,pTVar10,pTVar10,in_stack_00000008 + 8);
        tcg_gen_sari_vec_sparc(tcg_ctx,1,pTVar14,pTVar14,in_stack_00000008 + 8);
        vec_gen_3_sparc(tcg_ctx,INDEX_op_x86_packss_vec,type,0,a0,(TCGArg)pTVar5,(TCGArg)pTVar6);
        uVar12 = *(ulong *)pTVar5;
        *(ulong *)pTVar5 = uVar12 & 0xffffff5fffffffff;
        puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                          (uVar7 >> 6) * 8 +
                          (ulong)((((uint)(uVar12 >> 0x26) & 1) * 5 +
                                  ((uint)(uVar12 >> 0x10) & 0xff)) * 0x40));
        *puVar1 = *puVar1 | 1L << ((byte)uVar7 & 0x3f);
        uVar12 = *(ulong *)pTVar6;
        *(ulong *)pTVar6 = uVar12 & 0xffffff5fffffffff;
        iVar9 = ((uint)(uVar12 >> 0x26) & 1) * 5 + ((uint)(uVar12 >> 0x10) & 0xff);
      }
      uVar12 = ((long)(pTVar14 + -0x388) >> 3) * 0x6db6db6db6db6db7;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar12 >> 6) * 8 + (ulong)(uint)(iVar9 << 6));
      *puVar1 = *puVar1 | 1L << ((byte)uVar12 & 0x3f);
      break;
    case INDEX_op_cmp_vec:
      _Var4 = expand_vec_cmp_noinv
                        (tcg_ctx,type,vece,pTVar10,pTVar15,
                         (TCGv_vec)(in_stack_00000008 - (long)tcg_ctx),TStack0000000000000010);
      if (_Var4) {
        tcg_gen_not_vec_sparc(tcg_ctx,vece,pTVar10,pTVar10);
      }
      break;
    case INDEX_op_cmpsel_vec:
      pTVar5 = tcg_temp_new_internal_sparc(tcg_ctx,type,false);
      _Var4 = expand_vec_cmp_noinv
                        (tcg_ctx,type,vece,(TCGv_vec)((long)pTVar5 - (long)tcg_ctx),pTVar15,
                         (TCGv_vec)(in_stack_00000008 - (long)tcg_ctx),in_stack_00000020);
      lVar13 = _TStack0000000000000010 - (long)tcg_ctx;
      lVar3 = in_stack_00000018 - (long)tcg_ctx;
      if (_Var4) {
        lVar13 = in_stack_00000018 - (long)tcg_ctx;
        lVar3 = _TStack0000000000000010 - (long)tcg_ctx;
      }
      uVar7 = ((long)((TCGv_vec)((long)pTVar5 - (long)tcg_ctx) + -0x388) >> 3) * 0x6db6db6db6db6db7;
      vec_gen_4_sparc(tcg_ctx,INDEX_op_x86_vpblendvb_vec,type,vece,a0,
                      (long)&tcg_ctx->pool_cur + lVar3,(long)&tcg_ctx->pool_cur + lVar13,
                      (TCGArg)pTVar5);
      uVar12 = *(ulong *)pTVar5;
      *(ulong *)pTVar5 = uVar12 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar7 >> 6) * 8 +
                        (ulong)((((uint)(uVar12 >> 0x26) & 1) * 5 + ((uint)(uVar12 >> 0x10) & 0xff))
                               * 0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar7 & 0x3f);
    }
  }
  else if (opc == INDEX_op_mul_vec) {
    if (type - TCG_TYPE_V128 < 2) {
      pTVar5 = tcg_temp_new_internal_sparc(tcg_ctx,type,false);
      pTVar15 = (TCGv_vec)((long)pTVar5 - (long)tcg_ctx);
      pTVar6 = tcg_temp_new_internal_sparc(tcg_ctx,type,false);
      r = tcg_temp_new_internal_sparc(tcg_ctx,type,false);
      pTVar14 = (TCGv_vec)((long)r - (long)tcg_ctx);
      b = tcg_temp_new_internal_sparc(tcg_ctx,type,false);
      pTVar10 = (TCGv_vec)((long)b - (long)tcg_ctx);
      tcg_gen_dup16i_vec_sparc(tcg_ctx,pTVar10,0);
      uVar7 = ((long)(pTVar15 + -0x388) >> 3) * 0x6db6db6db6db6db7;
      vec_gen_3_sparc(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,(TCGArg)pTVar5,in_R9,(TCGArg)b);
      uVar8 = ((long)((TCGv_vec)((long)pTVar6 - (long)tcg_ctx) + -0x388) >> 3) * 0x6db6db6db6db6db7;
      vec_gen_3_sparc(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,(TCGArg)pTVar6,(TCGArg)b,
                      in_stack_00000008);
      uVar11 = ((long)(pTVar14 + -0x388) >> 3) * 0x6db6db6db6db6db7;
      vec_gen_3_sparc(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,(TCGArg)r,in_R9,(TCGArg)b);
      vec_gen_3_sparc(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,(TCGArg)b,(TCGArg)b,in_stack_00000008)
      ;
      tcg_gen_mul_vec_sparc(tcg_ctx,1,pTVar15,pTVar15,(TCGv_vec)((long)pTVar6 - (long)tcg_ctx));
      tcg_gen_mul_vec_sparc(tcg_ctx,1,pTVar14,pTVar14,pTVar10);
      tcg_gen_shri_vec_sparc(tcg_ctx,1,pTVar15,pTVar15,8);
      tcg_gen_shri_vec_sparc(tcg_ctx,1,pTVar14,pTVar14,8);
      vec_gen_3_sparc(tcg_ctx,INDEX_op_x86_packus_vec,type,0,a0,(TCGArg)pTVar5,(TCGArg)r);
      uVar12 = *(ulong *)pTVar5;
      *(ulong *)pTVar5 = uVar12 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar7 >> 6) * 8 +
                        (ulong)(((uint)((uVar12 & 0x4000000000) != 0) * 5 +
                                ((uint)(uVar12 >> 0x10) & 0xff)) * 0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar7 & 0x3f);
      uVar12 = *(ulong *)pTVar6;
      *(ulong *)pTVar6 = uVar12 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar8 >> 6) * 8 +
                        (ulong)(((uint)((uVar12 & 0x4000000000) != 0) * 5 +
                                ((uint)(uVar12 >> 0x10) & 0xff)) * 0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar8 & 0x3f);
      uVar12 = *(ulong *)r;
      *(ulong *)r = uVar12 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar11 >> 6) * 8 +
                        (ulong)(((uint)((uVar12 & 0x4000000000) != 0) * 5 +
                                ((uint)(uVar12 >> 0x10) & 0xff)) * 0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar11 & 0x3f);
    }
    else {
      if (type != TCG_TYPE_V64) {
        iVar9 = 0xd7e;
        goto LAB_009d5d89;
      }
      pTVar5 = tcg_temp_new_internal_sparc(tcg_ctx,TCG_TYPE_V128,false);
      pTVar15 = (TCGv_vec)((long)pTVar5 - (long)tcg_ctx);
      pTVar6 = tcg_temp_new_internal_sparc(tcg_ctx,TCG_TYPE_V128,false);
      pTVar10 = (TCGv_vec)((long)pTVar6 - (long)tcg_ctx);
      tcg_gen_dup16i_vec_sparc(tcg_ctx,pTVar10,0);
      uVar7 = ((long)(pTVar15 + -0x388) >> 3) * 0x6db6db6db6db6db7;
      vec_gen_3_sparc(tcg_ctx,INDEX_op_x86_punpckl_vec,TCG_TYPE_V128,0,(TCGArg)pTVar5,in_R9,
                      (TCGArg)pTVar6);
      vec_gen_3_sparc(tcg_ctx,INDEX_op_x86_punpckl_vec,TCG_TYPE_V128,0,(TCGArg)pTVar6,(TCGArg)pTVar6
                      ,in_stack_00000008);
      tcg_gen_mul_vec_sparc(tcg_ctx,1,pTVar15,pTVar15,pTVar10);
      tcg_gen_shri_vec_sparc(tcg_ctx,1,pTVar15,pTVar15,8);
      vec_gen_3_sparc(tcg_ctx,INDEX_op_x86_packus_vec,TCG_TYPE_V128,0,a0,(TCGArg)pTVar5,
                      (TCGArg)pTVar5);
      uVar12 = *(ulong *)pTVar5;
      *(ulong *)pTVar5 = uVar12 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar7 >> 6) * 8 +
                        (ulong)(((uint)((uVar12 & 0x4000000000) != 0) * 5 +
                                ((uint)(uVar12 >> 0x10) & 0xff)) * 0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar7 & 0x3f);
    }
    local_118 = ((long)(pTVar10 + -0x388) >> 3) * 0x6db6db6db6db6db7;
    uVar12 = *(ulong *)(pTVar10 + (long)&tcg_ctx->pool_cur);
    *(ulong *)(pTVar10 + (long)&tcg_ctx->pool_cur) = uVar12 & 0xffffff5fffffffff;
    puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                      (local_118 >> 6) * 8 +
                      (ulong)(((uint)((uVar12 & 0x4000000000) != 0) * 5 +
                              ((uint)(uVar12 >> 0x10) & 0xff)) * 0x40));
    *puVar1 = *puVar1 | 1L << ((byte)local_118 & 0x3f);
  }
  return;
}

Assistant:

void tcg_expand_vec_op(TCGContext *tcg_ctx, TCGOpcode opc, TCGType type, unsigned vece,
                       TCGArg a0, ...)
{
    va_list va;
    TCGArg a2;
    TCGv_vec v0, v1, v2, v3, v4;

    va_start(va, a0);
    v0 = temp_tcgv_vec(tcg_ctx, arg_temp(a0));
    v1 = temp_tcgv_vec(tcg_ctx, arg_temp(va_arg(va, TCGArg)));
    a2 = va_arg(va, TCGArg);

    switch (opc) {
    case INDEX_op_shli_vec:
    case INDEX_op_shri_vec:
        expand_vec_shi(tcg_ctx, type, vece, opc == INDEX_op_shri_vec, v0, v1, a2);
        break;

    case INDEX_op_sari_vec:
        expand_vec_sari(tcg_ctx, type, vece, v0, v1, a2);
        break;

    case INDEX_op_mul_vec:
        v2 = temp_tcgv_vec(tcg_ctx, arg_temp(a2));
        expand_vec_mul(tcg_ctx, type, vece, v0, v1, v2);
        break;

    case INDEX_op_cmp_vec:
        v2 = temp_tcgv_vec(tcg_ctx, arg_temp(a2));
        expand_vec_cmp(tcg_ctx, type, vece, v0, v1, v2, va_arg(va, TCGArg));
        break;

    case INDEX_op_cmpsel_vec:
        v2 = temp_tcgv_vec(tcg_ctx, arg_temp(a2));
        v3 = temp_tcgv_vec(tcg_ctx, arg_temp(va_arg(va, TCGArg)));
        v4 = temp_tcgv_vec(tcg_ctx, arg_temp(va_arg(va, TCGArg)));
        expand_vec_cmpsel(tcg_ctx, type, vece, v0, v1, v2, v3, v4, va_arg(va, TCGArg));
        break;

    default:
        break;
    }

    va_end(va);
}